

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::rust::AccessorGenerator::GenerateMsgImpl
          (AccessorGenerator *this,Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  undefined4 in_register_0000000c;
  FieldDescriptor *field_00;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  Sub local_d8;
  
  field_00 = (FieldDescriptor *)CONCAT44(in_register_0000000c,accessor_case);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"comment",&local_119);
  FieldInfoComment_abi_cxx11_(&local_118,(rust *)ctx,(Context *)field,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_d8,&local_f8,&local_118);
  Context::Emit(ctx,&local_d8,1,0x18,"\n      // $comment$\n    ");
  io::Printer::Sub::~Sub(&local_d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  (*this->_vptr_AccessorGenerator[2])(this,ctx,field,(ulong)accessor_case);
  google::protobuf::io::Printer::WriteRaw((char *)ctx->printer_,0x3ee526);
  return;
}

Assistant:

void GenerateMsgImpl(Context& ctx, const FieldDescriptor& field,
                       AccessorCase accessor_case) const {
    ctx.Emit({{"comment", FieldInfoComment(ctx, field)}}, R"rs(
      // $comment$
    )rs");
    InMsgImpl(ctx, field, accessor_case);
    ctx.printer().PrintRaw("\n");
  }